

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::WalkStackForExceptionContext
               (ScriptContext *scriptContext,JavascriptExceptionContext *exceptionContext,
               Var thrownObject,uint64 stackCrawlLimit,PVOID returnAddress,bool isThrownException,
               bool resetSatck)

{
  JavascriptFunction *function;
  JavascriptFunction *jsFunc;
  uint32 callerBytecodeOffset;
  bool resetSatck_local;
  bool isThrownException_local;
  PVOID returnAddress_local;
  uint64 stackCrawlLimit_local;
  Var thrownObject_local;
  JavascriptExceptionContext *exceptionContext_local;
  ScriptContext *scriptContext_local;
  
  jsFunc._6_1_ = resetSatck;
  jsFunc._7_1_ = isThrownException;
  _callerBytecodeOffset = returnAddress;
  returnAddress_local = (PVOID)stackCrawlLimit;
  stackCrawlLimit_local = (uint64)thrownObject;
  thrownObject_local = exceptionContext;
  exceptionContext_local = (JavascriptExceptionContext *)scriptContext;
  function = WalkStackForExceptionContextInternal
                       (scriptContext,exceptionContext,thrownObject,(uint32 *)&jsFunc,
                        stackCrawlLimit,returnAddress,isThrownException,resetSatck);
  if (function != (JavascriptFunction *)0x0) {
    JavascriptExceptionContext::SetThrowingFunction
              ((JavascriptExceptionContext *)thrownObject_local,function,(uint32)jsFunc,
               _callerBytecodeOffset);
  }
  return;
}

Assistant:

void
        JavascriptExceptionOperators::WalkStackForExceptionContext(ScriptContext& scriptContext, JavascriptExceptionContext& exceptionContext, Var thrownObject, uint64 stackCrawlLimit, PVOID returnAddress, bool isThrownException, bool resetSatck)
    {
        uint32 callerBytecodeOffset;
        JavascriptFunction * jsFunc = WalkStackForExceptionContextInternal(scriptContext, exceptionContext, thrownObject, callerBytecodeOffset, stackCrawlLimit, returnAddress, isThrownException, resetSatck);

        if (jsFunc)
        {
            // If found, the caller is a function, and we can retrieve the debugger info from there
            // otherwise it's probably just accessing property. While it is still possible to throw
            // from that context, we just won't be able to get the line number etc., which make sense.
            exceptionContext.SetThrowingFunction(jsFunc, callerBytecodeOffset, returnAddress);
        }
    }